

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O0

int XcmeContext_Setup2(XcmeContext_s *c,char *display_name,int flags)

{
  undefined8 uVar1;
  int iVar2;
  Display *pDVar3;
  Window WVar4;
  Atom AVar5;
  undefined8 uVar6;
  char *pcVar7;
  undefined8 in_stack_fffffffffffffe98;
  undefined4 uVar8;
  undefined8 in_stack_fffffffffffffea0;
  undefined4 uVar9;
  undefined8 in_stack_fffffffffffffea8;
  undefined4 uVar10;
  char *local_128;
  undefined1 local_118 [8];
  XTextProperty text;
  char *strings [2];
  long local_e0;
  uchar *data;
  unsigned_long n;
  unsigned_long left;
  int has_display;
  int format;
  Atom actual;
  XSetWindowAttributes attrs;
  Colormap cmap;
  Visual *vis;
  int flags_local;
  char *display_name_local;
  XcmeContext_s *c_local;
  
  uVar10 = (undefined4)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  uVar8 = (undefined4)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  attrs.cursor = 0;
  left._0_4_ = 0;
  XSetErrorHandler(XcmeErrorHandler);
  if (c->display == (Display *)0x0) {
    pDVar3 = (Display *)XOpenDisplay(display_name);
    c->display = pDVar3;
    c->display_is_owned = 1;
  }
  else {
    left._0_4_ = 1;
  }
  if (c->display == (Display *)0x0) {
    local_128 = display_name;
    if (display_name == (char *)0x0) {
      local_128 = "???";
    }
    (*XcmMessage_p)(XCME_MSG_DISPLAY_ERROR,(void *)0x0,"could not open display %s",local_128);
    c_local._4_4_ = 1;
  }
  else {
    c->screen = *(int *)(c->display + 0xe0);
    WVar4 = XRootWindow(c->display,c->screen);
    c->root = WVar4;
    AVar5 = XInternAtom(c->display,"_ICC_COLOR_PROFILES",0);
    c->aProfile = AVar5;
    AVar5 = XInternAtom(c->display,"_ICC_COLOR_OUTPUTS",0);
    c->aOutputs = AVar5;
    AVar5 = XInternAtom(c->display,"_ICC_COLOR_MANAGEMENT",0);
    c->aCM = AVar5;
    AVar5 = XInternAtom(c->display,"_ICC_COLOR_REGIONS",0);
    c->aRegion = AVar5;
    AVar5 = XInternAtom(c->display,"_ICC_COLOR_DESKTOP",0);
    c->aDesktop = AVar5;
    AVar5 = XInternAtom(c->display,"_ICC_COLOR_DISPLAY_ADVANCED",0);
    c->aAdvanced = AVar5;
    AVar5 = XInternAtom(c->display,"_NET_DESKTOP_GEOMETRY",0);
    c->aNetDesktopGeometry = AVar5;
    if ((int)left == 0) {
      text.nitems = (unsigned_long)anon_var_dwarf_20a1;
      attrs._88_8_ = XCreateColormap(c->display,c->root,
                                     *(undefined8 *)
                                      (*(long *)(c->display + 0xe8) + (long)c->screen * 0x80 + 0x40)
                                     ,0);
      attrs.border_pixmap = 0;
      attrs.save_under = 0x428001;
      attrs._68_4_ = 0;
      attrs.cursor = attrs._88_8_;
      WVar4 = XCreateWindow(c->display,c->root,0,0,300,300,CONCAT44(uVar8,5),CONCAT44(uVar9,0x18),
                            CONCAT44(uVar10,1),
                            *(undefined8 *)
                             (*(long *)(c->display + 0xe8) + (long)c->screen * 0x80 + 0x40),0x2808,
                            &actual);
      c->w = WVar4;
      iVar2 = XStringListToTextProperty(&text.nitems,1,local_118);
      if (iVar2 != 0) {
        XSetWMName(c->display,c->w,local_118);
      }
    }
    pDVar3 = c->display;
    uVar1 = *(undefined8 *)(*(long *)(c->display + 0xe8) + 0x10);
    uVar6 = XInternAtom(c->display,"_NET_CLIENT_LIST",0);
    XGetWindowProperty(pDVar3,uVar1,uVar6,0,0xffffffffffffffff,0,0x21,&has_display,(long)&left + 4,
                       &data,&n,&local_e0);
    if ((local_e0 == 0) || (data == (uchar *)0x0)) {
      pcVar7 = "zero";
      if (data != (uchar *)0x0) {
        pcVar7 = "missed";
      }
      (*XcmMessage_p)(XCME_MSG_DISPLAY_ERROR,(void *)0x0,
                      "\nThe extented ICCCM hint _NET_CLIENT_LIST atom is %s\n!!! xcmevents will work limited !!!\n"
                      ,pcVar7);
    }
    XSelectInput(c->display,c->root,0x408000);
    XcmeSelectInput(c);
    c_local._4_4_ = 0;
  }
  return c_local._4_4_;
}

Assistant:

int      XcmeContext_Setup2          ( XcmeContext_s     * c,
                                       const char        * display_name,
                                       int                 flags XCM_UNUSED )
{
  /* Open the display and create our window. */
  Visual * vis = 0;
  Colormap cmap = 0;
  XSetWindowAttributes attrs;
  Atom actual;
  int format,
      has_display = 0;
  unsigned long left, n;
  unsigned char * data;

  XSetErrorHandler( XcmeErrorHandler );

  if(c->display)
    has_display = 1;
  else
  {
    c->display = XOpenDisplay( display_name );
    c->display_is_owned = 1;
  }
  if(!c->display)
  {
    DERR( "could not open display %s", display_name?display_name:"???" );
    return 1;
  }

  c->screen = DefaultScreen( c->display );
  c->root = XRootWindow( c->display, c->screen );

  /* define the observers interesst */
  c->aProfile = XInternAtom( c->display, XCM_COLOR_PROFILES, False );
  c->aOutputs = XInternAtom( c->display, XCM_COLOR_OUTPUTS, False );
  c->aCM = XInternAtom( c->display, "_ICC_COLOR_MANAGEMENT", False );
  c->aRegion = XInternAtom( c->display, XCM_COLOR_REGIONS, False );
  c->aDesktop = XInternAtom( c->display, XCM_COLOR_DESKTOP, False );
  c->aAdvanced = XInternAtom(c->display, XCM_COLOUR_DESKTOP_ADVANCED,False);
  c->aNetDesktopGeometry = XInternAtom( c->display, "_NET_DESKTOP_GEOMETRY", False );

  if(!has_display)
  {
    char * strings[] = {"XcmEvents",NULL};
    XTextProperty text;

    vis = DefaultVisual( c->display, c->screen );
    cmap = XCreateColormap( c->display, c->root, vis, AllocNone );
    attrs.colormap = cmap;
    attrs.border_pixel = 0;
    attrs.event_mask = StructureNotifyMask | ExposureMask | KeyPressMask |
                       PropertyChangeMask;

    c->w = XCreateWindow( c->display, c->root, 0, 0, 300, 300, 5, 24,
                          InputOutput, DefaultVisual( c->display, c->screen ),
                          CWBorderPixel | CWColormap | CWEventMask, &attrs);

    if(XStringListToTextProperty( strings, 1, &text))
      XSetWMName( c->display, c->w, &text );
    /*XMapWindow( display, w );*/
  }

  /* check if we can see other clients */
  XGetWindowProperty( c->display, RootWindow(c->display,0),
                      XInternAtom(c->display, "_NET_CLIENT_LIST", False),
                      0, ~0, False, XA_WINDOW,
                      &actual,&format, &n, &left, &data );
  if(!data || !n)
    DERR( "\nThe extented ICCCM hint _NET_CLIENT_LIST atom is %s\n"
          "!!! xcmevents will work limited !!!\n", n ? "missed" : "zero" );

  /* observe the root window as well for newly appearing windows */
  XSelectInput( c->display, c->root,
                PropertyChangeMask |   /* _ICC_COLOR_PROFILES */
                ExposureMask );        /* _ICC_COLOR_MANAGEMENT */

  /* observe windows */
  XcmeSelectInput( c );

  return 0;
}